

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::globalError
          (CommonCore *this,LocalFederateId federateID,int errorCode,string_view errorString)

{
  string_view message;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  GlobalBrokerId id;
  GlobalFederateId GVar4;
  FederateState *this_00;
  char *__str;
  int32_t in_EDX;
  undefined8 in_RDI;
  MessageProcessingResult ret;
  ActionMessage error;
  FederateState *fed;
  ActionMessage error_1;
  BrokerBase *in_stack_fffffffffffffdf8;
  undefined2 in_stack_fffffffffffffe00;
  MessageProcessingResult in_stack_fffffffffffffe02;
  MessageProcessingResult in_stack_fffffffffffffe03;
  FederateStates in_stack_fffffffffffffe04;
  FederateStates in_stack_fffffffffffffe05;
  undefined1 in_stack_fffffffffffffe06;
  undefined1 in_stack_fffffffffffffe07;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 uVar5;
  action_t startingAction;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  MessageProcessingResult busyReturn;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  int32_t local_1cc;
  GlobalFederateId in_stack_fffffffffffffe38;
  InterfaceHandle in_stack_fffffffffffffe3c;
  LocalFederateId in_stack_fffffffffffffe44;
  GlobalFederateId local_e4 [2];
  int32_t local_dc;
  BaseType local_d8;
  undefined4 local_28;
  int32_t local_24;
  LocalFederateId local_4;
  
  uVar5 = (undefined4)in_RDI;
  startingAction = (action_t)((ulong)in_RDI >> 0x20);
  local_28 = 0xfffffefd;
  local_24 = in_EDX;
  bVar1 = LocalFederateId::operator==(&local_4,(LocalFederateId)0xfffffefd);
  if (bVar1) {
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               startingAction);
    id = BrokerBase::getGlobalId(in_stack_fffffffffffffdf8);
    GlobalFederateId::GlobalFederateId(local_e4,id);
    local_d8 = local_e4[0].gid;
    local_dc = local_24;
    SmallBuffer::operator=
              ((SmallBuffer *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    BrokerBase::addActionMessage
              ((BrokerBase *)
               CONCAT17(in_stack_fffffffffffffe07,
                        CONCAT16(in_stack_fffffffffffffe06,
                                 CONCAT15(in_stack_fffffffffffffe05,
                                          CONCAT14(in_stack_fffffffffffffe04,
                                                   CONCAT13(in_stack_fffffffffffffe03,
                                                            CONCAT12(in_stack_fffffffffffffe02,
                                                                     in_stack_fffffffffffffe00))))))
               ,(ActionMessage *)in_stack_fffffffffffffdf8);
    ActionMessage::~ActionMessage
              ((ActionMessage *)
               CONCAT17(in_stack_fffffffffffffe07,
                        CONCAT16(in_stack_fffffffffffffe06,
                                 CONCAT15(in_stack_fffffffffffffe05,
                                          CONCAT14(in_stack_fffffffffffffe04,
                                                   CONCAT13(in_stack_fffffffffffffe03,
                                                            CONCAT12(in_stack_fffffffffffffe02,
                                                                     in_stack_fffffffffffffe00))))))
              );
  }
  else {
    this_00 = getFederateAt((CommonCore *)
                            CONCAT44(in_stack_fffffffffffffe3c.hid,in_stack_fffffffffffffe38.gid),
                            in_stack_fffffffffffffe44);
    if (this_00 == (FederateState *)0x0) {
      __str = (char *)__cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),__str);
      message._M_len._4_4_ = startingAction;
      message._M_len._0_4_ = uVar5;
      message._M_str._0_7_ = in_stack_fffffffffffffe20;
      message._M_str._7_1_ = in_stack_fffffffffffffe27;
      InvalidIdentifier::InvalidIdentifier
                ((InvalidIdentifier *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 message);
      __cxa_throw(__str,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
    }
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               startingAction);
    GVar4 = std::atomic<helics::GlobalFederateId>::load(&this_00->global_id,seq_cst);
    local_1cc = local_24;
    SmallBuffer::operator=
              ((SmallBuffer *)CONCAT44(GVar4.gid,in_stack_fffffffffffffe28),
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    uVar2 = FederateState::isCallbackFederate(this_00);
    if ((bool)uVar2) {
      setActionFlag<helics::ActionMessage,helics::GeneralFlags>
                ((ActionMessage *)&stack0xfffffffffffffe30,indicator_flag);
    }
    BrokerBase::addActionMessage
              ((BrokerBase *)
               CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffe06,
                                       CONCAT15(in_stack_fffffffffffffe05,
                                                CONCAT14(in_stack_fffffffffffffe04,
                                                         CONCAT13(in_stack_fffffffffffffe03,
                                                                  CONCAT12(in_stack_fffffffffffffe02
                                                                           ,
                                                  in_stack_fffffffffffffe00)))))),
               (ActionMessage *)in_stack_fffffffffffffdf8);
    uVar3 = FederateState::isCallbackFederate(this_00);
    if (!(bool)uVar3) {
      FederateState::addAction
                ((FederateState *)
                 CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffffe05,
                                                        CONCAT14(in_stack_fffffffffffffe04,
                                                                 CONCAT13(in_stack_fffffffffffffe03,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffe02,
                                                  in_stack_fffffffffffffe00)))))),
                 (ActionMessage *)in_stack_fffffffffffffdf8);
      busyReturn = NEXT_STEP;
      while (((busyReturn != ERROR_RESULT &&
              (in_stack_fffffffffffffe05 = FederateState::getState((FederateState *)0x467396),
              in_stack_fffffffffffffe05 != FINISHED)) &&
             (in_stack_fffffffffffffe04 = FederateState::getState((FederateState *)0x4673b1),
             in_stack_fffffffffffffe04 != ERRORED))) {
        in_stack_fffffffffffffe02 =
             FederateState::genericUnspecifiedQueueProcess
                       ((FederateState *)CONCAT44(GVar4.gid,in_stack_fffffffffffffe28),
                        (bool)busyReturn);
        in_stack_fffffffffffffe03 = in_stack_fffffffffffffe02;
        if (((in_stack_fffffffffffffe02 == HALTED) || (in_stack_fffffffffffffe02 == ERROR_RESULT))
           || (busyReturn = in_stack_fffffffffffffe02, in_stack_fffffffffffffe02 == BUSY)) break;
      }
    }
    ActionMessage::~ActionMessage
              ((ActionMessage *)
               CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffffe05,
                                                      CONCAT14(in_stack_fffffffffffffe04,
                                                               CONCAT13(in_stack_fffffffffffffe03,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffe02,
                                                  in_stack_fffffffffffffe00)))))));
  }
  return;
}

Assistant:

void CommonCore::globalError(LocalFederateId federateID,
                             int errorCode,
                             std::string_view errorString)
{
    if (federateID == gLocalCoreId) {
        ActionMessage error(CMD_GLOBAL_ERROR);
        error.source_id = getGlobalId();
        error.messageID = errorCode;
        error.payload = errorString;
        addActionMessage(error);
        return;
    }
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid error"));
    }
    ActionMessage error(CMD_GLOBAL_ERROR);
    error.source_id = fed->global_id.load();
    error.messageID = errorCode;
    error.payload = errorString;
    if (fed->isCallbackFederate()) {
        setActionFlag(error, indicator_flag);
    }
    addActionMessage(error);
    if (fed->isCallbackFederate()) {
        return;
    }
    fed->addAction(error);
    MessageProcessingResult ret = MessageProcessingResult::NEXT_STEP;
    while (ret != MessageProcessingResult::ERROR_RESULT) {
        if (fed->getState() == FederateStates::FINISHED ||
            fed->getState() == FederateStates::ERRORED) {
            return;
        }
        ret = fed->genericUnspecifiedQueueProcess(false);
        switch (ret) {
            case MessageProcessingResult::ERROR_RESULT:
            case MessageProcessingResult::HALTED:
            case MessageProcessingResult::BUSY:
                return;
            default:
                break;
        }
    }
}